

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void mutate_sign_signed30(secp256k1_modinv32_signed30 *x)

{
  int iVar1;
  uint64_t uVar2;
  long in_RDI;
  int pos;
  int i;
  int in_stack_ffffffffffffffec;
  int local_c;
  
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    uVar2 = secp256k1_testrand_bits(in_stack_ffffffffffffffec);
    iVar1 = (int)uVar2;
    if ((*(int *)(in_RDI + (long)iVar1 * 4) < 1) ||
       (0x3fffffff < *(int *)(in_RDI + (long)(iVar1 + 1) * 4))) {
      if ((*(int *)(in_RDI + (long)iVar1 * 4) < 0) &&
         (0x3ffffffe < *(int *)(in_RDI + (long)(iVar1 + 1) * 4))) {
        *(int *)(in_RDI + (long)iVar1 * 4) = *(int *)(in_RDI + (long)iVar1 * 4) + 0x40000000;
        *(int *)(in_RDI + (long)(iVar1 + 1) * 4) = *(int *)(in_RDI + (long)(iVar1 + 1) * 4) + -1;
      }
    }
    else {
      *(int *)(in_RDI + (long)iVar1 * 4) = *(int *)(in_RDI + (long)iVar1 * 4) + -0x40000000;
      *(int *)(in_RDI + (long)(iVar1 + 1) * 4) = *(int *)(in_RDI + (long)(iVar1 + 1) * 4) + 1;
    }
  }
  return;
}

Assistant:

static void mutate_sign_signed30(secp256k1_modinv32_signed30* x) {
    int i;
    for (i = 0; i < 16; ++i) {
        int pos = secp256k1_testrand_bits(3);
        if (x->v[pos] > 0 && x->v[pos + 1] <= 0x3fffffff) {
            x->v[pos] -= 0x40000000;
            x->v[pos + 1] += 1;
        } else if (x->v[pos] < 0 && x->v[pos + 1] >= 0x3fffffff) {
            x->v[pos] += 0x40000000;
            x->v[pos + 1] -= 1;
        }
    }
}